

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O1

void SetupMapping(aiMaterial *mat,aiTextureMapping mode,aiVector3D *axis)

{
  int iVar1;
  aiMaterialProperty *paVar2;
  aiTextureMapping *paVar3;
  aiMaterialProperty *paVar4;
  char *pcVar5;
  aiMaterialProperty **ppaVar6;
  ulong uVar7;
  vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> p;
  aiMaterialProperty *m;
  aiMaterialProperty *prop;
  vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> local_68;
  aiMaterialProperty *local_48;
  aiMaterialProperty *local_40;
  aiVector3D *local_38;
  
  local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
  super__Vector_impl_data._M_start = (aiMaterialProperty **)0x0;
  local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiMaterialProperty **)0x0;
  local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiMaterialProperty **)0x0;
  local_38 = axis;
  std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::reserve
            (&local_68,(ulong)(mat->mNumProperties + 1));
  if (mat->mNumProperties != 0) {
    uVar7 = 0;
    do {
      ppaVar6 = mat->mProperties;
      paVar4 = ppaVar6[uVar7];
      pcVar5 = (paVar4->mKey).data;
      local_40 = paVar4;
      iVar1 = strcmp(pcVar5,"$tex.file");
      if (iVar1 == 0) {
        paVar2 = (aiMaterialProperty *)operator_new(0x420);
        (paVar2->mKey).length = 0;
        (paVar2->mKey).data[0] = '\0';
        memset((paVar2->mKey).data + 1,0x1b,0x3ff);
        paVar2->mSemantic = 0;
        paVar2->mIndex = 0;
        paVar2->mDataLength = 0;
        paVar2->mType = aiPTI_Float;
        paVar2->mData = (char *)0x0;
        (paVar2->mKey).length = 0xc;
        builtin_strncpy((paVar2->mKey).data,"$tex.mapping",0xd);
        paVar2->mIndex = paVar4->mIndex;
        paVar2->mSemantic = paVar4->mSemantic;
        paVar2->mDataLength = 4;
        paVar2->mType = aiPTI_Integer;
        local_48 = paVar2;
        paVar3 = (aiTextureMapping *)operator_new__(4);
        paVar2->mData = (char *)paVar3;
        *paVar3 = mode;
        if (local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>>::
          _M_realloc_insert<aiMaterialProperty*const&>
                    ((vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>> *)&local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_40);
        }
        else {
          *local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = paVar4;
          local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>>::
          _M_realloc_insert<aiMaterialProperty*const&>
                    ((vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>> *)&local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_48);
        }
        else {
          *local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_48;
          local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if ((mode < aiTextureMapping_OTHER) && ((0x16U >> (mode & 0x1f) & 1) != 0)) {
          paVar4 = (aiMaterialProperty *)operator_new(0x420);
          (paVar4->mKey).length = 0;
          (paVar4->mKey).data[0] = '\0';
          memset((paVar4->mKey).data + 1,0x1b,0x3ff);
          paVar4->mSemantic = 0;
          paVar4->mIndex = 0;
          paVar4->mDataLength = 0;
          paVar4->mType = aiPTI_Float;
          paVar4->mData = (char *)0x0;
          (paVar4->mKey).length = 0xc;
          builtin_strncpy((paVar4->mKey).data,"$tex.mapaxis",0xd);
          paVar4->mIndex = local_40->mIndex;
          paVar4->mSemantic = local_40->mSemantic;
          paVar4->mDataLength = 0xc;
          paVar4->mType = aiPTI_Float;
          local_48 = paVar4;
          pcVar5 = (char *)operator_new__(0xc);
          paVar4->mData = pcVar5;
          *(float *)(pcVar5 + 8) = local_38->z;
          *(undefined8 *)pcVar5 = *(undefined8 *)local_38;
          if (local_68.
              super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_68.
              super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            *local_68.
             super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl
             .super__Vector_impl_data._M_finish = paVar4;
            goto LAB_0043a59f;
          }
          std::vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>>::
          _M_realloc_insert<aiMaterialProperty*const&>
                    ((vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>> *)&local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_48);
        }
      }
      else {
        iVar1 = strcmp(pcVar5,"$tex.uvwsrc");
        if (iVar1 == 0) {
          paVar4 = ppaVar6[uVar7];
          if (paVar4 != (aiMaterialProperty *)0x0) {
            if (paVar4->mData != (char *)0x0) {
              operator_delete__(paVar4->mData);
            }
            paVar4->mData = (char *)0x0;
            operator_delete(paVar4);
          }
        }
        else if (local_68.
                 super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish ==
                 local_68.
                 super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>>::
          _M_realloc_insert<aiMaterialProperty*const&>
                    ((vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>> *)&local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_40);
        }
        else {
          *local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = paVar4;
LAB_0043a59f:
          local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < mat->mNumProperties);
  }
  if (local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    if ((ulong)mat->mNumAllocated <
        (ulong)((long)local_68.
                      super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_68.
                      super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      if (mat->mProperties != (aiMaterialProperty **)0x0) {
        operator_delete__(mat->mProperties);
      }
      uVar7 = (long)local_68.
                    super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_68.
                    super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      ppaVar6 = (aiMaterialProperty **)
                operator_new__(-(ulong)((uVar7 & 0x7000000000000000) != 0) |
                               ((long)local_68.
                                      super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_68.
                                     super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) * 2);
      mat->mProperties = ppaVar6;
      mat->mNumAllocated = (int)uVar7 * 2;
    }
    mat->mNumProperties =
         (uint)((ulong)((long)local_68.
                              super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_68.
                             super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    memcpy(mat->mProperties,
           local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
           _M_impl.super__Vector_impl_data._M_start,
           (long)local_68.
                 super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_68.
                 super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                 _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8);
  }
  if (local_68.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (aiMaterialProperty **)0x0) {
    operator_delete(local_68.
                    super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SetupMapping (aiMaterial* mat, aiTextureMapping mode, const aiVector3D& axis = aiVector3D(0.f,0.f,-1.f))
{
    // Check whether there are texture properties defined - setup
    // the desired texture mapping mode for all of them and ignore
    // all UV settings we might encounter. WE HAVE NO UVS!

    std::vector<aiMaterialProperty*> p;
    p.reserve(mat->mNumProperties+1);

    for (unsigned int i = 0; i < mat->mNumProperties;++i)
    {
        aiMaterialProperty* prop = mat->mProperties[i];
        if (!::strcmp( prop->mKey.data, "$tex.file"))   {
            // Setup the mapping key
            aiMaterialProperty* m = new aiMaterialProperty();
            m->mKey.Set("$tex.mapping");
            m->mIndex    = prop->mIndex;
            m->mSemantic = prop->mSemantic;
            m->mType     = aiPTI_Integer;

            m->mDataLength = 4;
            m->mData = new char[4];
            *((int*)m->mData) = mode;

            p.push_back(prop);
            p.push_back(m);

            // Setup the mapping axis
            if (mode == aiTextureMapping_CYLINDER || mode == aiTextureMapping_PLANE || mode == aiTextureMapping_SPHERE) {
                m = new aiMaterialProperty();
                m->mKey.Set("$tex.mapaxis");
                m->mIndex    = prop->mIndex;
                m->mSemantic = prop->mSemantic;
                m->mType     = aiPTI_Float;

                m->mDataLength = 12;
                m->mData = new char[12];
                *((aiVector3D*)m->mData) = axis;
                p.push_back(m);
            }
        }
        else if (! ::strcmp( prop->mKey.data, "$tex.uvwsrc"))   {
            delete mat->mProperties[i];
        }
        else p.push_back(prop);
    }

    if (p.empty())return;

    // rebuild the output array
    if (p.size() > mat->mNumAllocated)  {
        delete[] mat->mProperties;
        mat->mProperties = new aiMaterialProperty*[p.size()*2];

        mat->mNumAllocated = static_cast<unsigned int>(p.size()*2);
    }
    mat->mNumProperties = (unsigned int)p.size();
    ::memcpy(mat->mProperties,&p[0],sizeof(void*)*mat->mNumProperties);
}